

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

CHAR CNNModelPredictBinary56(CharCNNClassifier *model,IplImage *pImage)

{
  uint uVar1;
  long lVar2;
  CharCNNClassifier *pCVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  INT32U IVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uStack_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_4c;
  ulong local_48;
  CharCNNClassifier *local_40;
  ulong local_38;
  
  uVar4 = (model->model_binary_56).C11.outChannels;
  lVar2 = -0x78 - ((ulong)(uVar4 * 0xa9) * 4 + 0xf & 0xfffffffffffffff0);
  local_58 = (long)&local_78 +
             (lVar2 - ((ulong)(model->model_binary_56).FC1.inputNum * 4 + 0xf & 0xfffffffffffffff0))
             + 0x78;
  local_40 = model;
  lVar8 = local_58 - ((ulong)(model->model_binary_56).FC1.outputNum * 4 + 0xf & 0xfffffffffffffff0);
  local_60 = lVar8;
  local_38 = 0;
  uVar5 = 0;
  while (uVar5 < uVar4) {
    local_4c = Binary56_C11_B_Weight[uVar5];
    local_68 = (long)&local_78 + ((long)(uVar5 * 0xa900000000) >> 0x1e) + lVar2 + 0x78;
    local_70 = uVar5;
    uVar5 = 0;
    while (uVar5 != 0xd) {
      local_78 = uVar5 * 0x34 + local_68;
      local_48 = uVar5;
      for (lVar10 = 0; lVar10 != 0xd; lVar10 = lVar10 + 1) {
        iVar12 = 0;
        uVar5 = local_48;
        for (IVar7 = 0; IVar7 != (local_40->model_binary_56).C11.height; IVar7 = IVar7 + 1) {
          uVar4 = (local_40->model_binary_56).C11.widthStep;
          for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
            iVar12 = iVar12 + (uint)pImage->imageData
                                    [(int)(pImage->widthStep * (int)uVar5 + (int)lVar10 +
                                          (int)uVar14)] *
                              Binary56_C11_Map_Weight
                              [(int)(uVar4 * IVar7 + (int)local_38 + (int)uVar14)];
          }
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        iVar12 = iVar12 + local_4c;
        *(undefined8 *)(lVar8 + -8) = 0x1028c0;
        iVar12 = TanhApproximateFunction(iVar12);
        *(int *)(local_78 + lVar10 * 4) = iVar12;
      }
      uVar5 = local_48 + 1;
    }
    uVar4 = (local_40->model_binary_56).C11.outChannels;
    local_38 = (ulong)((int)local_38 + 9);
    uVar5 = local_70 + 1;
  }
  uVar14 = 0;
  *(undefined8 *)(lVar8 + -8) = 0xfffffffffffffff6;
  pCVar3 = local_40;
  lVar10 = local_60;
  uVar5 = *(ulong *)(lVar8 + -8);
  for (uVar13 = 0; uVar13 != uVar4; uVar13 = uVar13 + 1) {
    local_48 = uVar13;
    local_38 = uVar14;
    uVar6 = uVar14;
    for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
      uVar15 = uVar6;
      for (lVar19 = 0; lVar19 != 6; lVar19 = lVar19 + 1) {
        uVar18 = uVar5 & 0xffffffff;
        uVar11 = uVar15;
        for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
          for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
            uVar1 = *(uint *)((long)&local_78 + (long)((int)uVar11 + (int)lVar9) * 4 + lVar2 + 0x78)
            ;
            if ((int)uVar18 < (int)uVar1) {
              uVar18 = (ulong)uVar1;
            }
          }
          uVar11 = uVar11 + 0xd;
        }
        *(int *)(lVar17 * 0x18 + ((long)(uVar13 * 0x2400000000) >> 0x1e) + local_58 + lVar19 * 4) =
             (int)uVar18;
        uVar15 = uVar15 + 2;
      }
      uVar6 = uVar6 + 0x1a;
    }
    uVar14 = uVar14 + 0xa9;
  }
  for (uVar5 = 0; uVar5 < (pCVar3->model_binary_56).FC1.outputNum; uVar5 = uVar5 + 1) {
    uVar4 = (pCVar3->model_binary_56).FC1.inputNum;
    iVar12 = 0;
    for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
      iVar12 = iVar12 + Binary56_FC1_Map_Weight[uVar4 * (int)uVar5 + (int)uVar14] *
                        *(int *)(local_58 + uVar14 * 4);
    }
    iVar16 = Binary56_FC1_B_Weight[uVar5];
    *(undefined8 *)(lVar8 + -8) = 0x102a06;
    iVar12 = TanhApproximateFunction(iVar12 + iVar16);
    *(int *)(lVar10 + uVar5 * 4) = iVar12;
  }
  iVar12 = -10000;
  uVar5 = 0;
  for (uVar14 = 0; uVar14 != (pCVar3->model_binary_56).FC2.outputNum; uVar14 = uVar14 + 1) {
    uVar4 = (pCVar3->model_binary_56).FC2.inputNum;
    iVar16 = 0;
    for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
      iVar16 = iVar16 + Binary56_FC2_Map_Weight[uVar4 * (int)uVar14 + (int)uVar13] *
                        *(int *)(lVar10 + uVar13 * 4);
    }
    if (iVar12 < iVar16 + Binary56_FC2_B_Weight[uVar14]) {
      uVar5 = uVar14 & 0xffffffff;
      iVar12 = iVar16 + Binary56_FC2_B_Weight[uVar14];
    }
  }
  return '\x06' - ((int)uVar5 == 0);
}

Assistant:

CHAR CNNModelPredictBinary56(CharCNNClassifier *model, IplImage *pImage) {
    int row, col, i, j, k;
    INT8U output_row, output_col;
    int map_index_position, image_index_position;
    int sum, max, value;
    int c11_output[model->model_binary_56.C11.outChannels * 13 * 13];
//    int c21_output[25 * 11 * 11], c31_output[25 * 9 * 9];
    int merge_output[model->model_binary_56.FC1.inputNum];
    int fc1_output[model->model_binary_56.FC1.outputNum];
// convolution - layer
//    3*3
//    15-3+1=13
    output_row = 13;
    output_col = 13;
    for (k = 0; k < model->model_binary_56.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                sum = 0;
                for (row = 0; row < model->model_binary_56.C11.height; row++) {
                    for (col = 0; col < model->model_binary_56.C11.widthStep; col++) {
                        //      index position
                        map_index_position = k * 3 * 3 + row * model->model_binary_56.C11.widthStep + col;
                        image_index_position = (i + row) * pImage->widthStep + (j + col);
//                        printf("%d,%d\n", map_index_position, image_index_position);
//                        printf("%ld,%d,%ld\n", C11_Map_Weight[map_index_position],
//                               pImage->imageData[image_index_position],
//                               C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position]);
                        sum += Binary56_C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position];
                    }
                }
                c11_output[k * output_row * output_row + i * output_row + j] = TanhApproximateFunction(
                        sum + Binary56_C11_B_Weight[k]);
//                printf("%ld\n",sum + C11_B_Weight[k]);
            }
        }
//                printmat(pImage);
//        printmat2(c11_output, 13, 13);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }


    output_row = 6;
    output_col = 6;
    for (k = 0; k < model->model_binary_56.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                max = -10;
                for (row = 0; row < 2; row++) {
                    for (col = 0; col < 2; col++) {
                        value = c11_output[k * 13 * 13 + (2 * i + row) * 13 + (2 * j + col)];
                        if (value > max) {
                            max = value;
                        }

                    }
                }
                merge_output[k * 6 * 6 + i * 6 + j] = max;
            }
        }
//        printmat2(merge_output, 6, 6);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }
    //endregion


    //region FC1 - 360*40

    for (row = 0; row < model->model_binary_56.FC1.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_56.FC1.inputNum; col++) {
            sum += merge_output[col] * Binary56_FC1_Map_Weight[row * model->model_binary_56.FC1.inputNum + col];
        }
//        fc1_output[row] = tanhf(sum + FC1_B_Weight[row]);
        fc1_output[row] = TanhApproximateFunction(sum + Binary56_FC1_B_Weight[row]);
//        fc1_output[row] = sum + FC1_B_Weight[row];
    }
    //endregion

//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",fc1_output[col]);
//    }
//    printf("\n");
//
//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[7*model->model_binary_56.FC2.inputNum+col]);
//    }
//    printf("\n");
//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[33*model->model_binary_56.FC2.inputNum+col]);
//    }
//    printf("\n");
    //region FC2 - 40*34
    max = -10000;
    k = 0;

    for (row = 0; row < model->model_binary_56.FC2.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//            printf("%d,%d\n",fc1_output[col],FC2_Map_Weight[row * model->model_binary_56.FC2.inputNum + col]);
            sum += fc1_output[col] * Binary56_FC2_Map_Weight[row * model->model_binary_56.FC2.inputNum + col];
        }
        value = sum + Binary56_FC2_B_Weight[row];
//        printf("%ld\n",value);
        if (value > max) {
            max = value;
            k = row;
        }
    }
    //endregion

//    printf("%f,%d\n",max,k);
    if (k == 0)
        return 5;
    else
        return 6;
//    return '1' ;
}